

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_only.c
# Opt level: O0

void getRandomBlock(int ndim,int *dims,int *blocksize,int *lo,int *hi)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int d;
  int toss;
  undefined4 local_30;
  
  for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
    iVar1 = rand();
    iVar1 = iVar1 % (*(int *)(in_RSI + (long)local_30 * 4) - *(int *)(in_RDX + (long)local_30 * 4));
    *(int *)(in_RCX + (long)local_30 * 4) = iVar1;
    *(int *)(in_R8 + (long)local_30 * 4) = iVar1 + *(int *)(in_RDX + (long)local_30 * 4) + -1;
  }
  return;
}

Assistant:

void getRandomBlock( int ndim, int dims[], int blocksize[], int lo[], int hi[])
{
  int toss;
  int d;
  for (d=0; d<ndim; d++) {
    toss = rand()%(dims[d]-blocksize[d]);
    lo[d] = toss;
    hi[d] = toss+blocksize[d]-1;
  }
}